

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1Input.cpp
# Opt level: O3

Type1CharString * __thiscall
Type1Input::GetGlyphCharString(Type1Input *this,string *inCharStringName)

{
  iterator iVar1;
  _Base_ptr p_Var2;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Type1CharString>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Type1CharString>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Type1CharString>_>_>
          ::find(&(this->mCharStrings)._M_t,inCharStringName);
  p_Var2 = (_Base_ptr)0x0;
  if ((_Rb_tree_header *)iVar1._M_node != &(this->mCharStrings)._M_t._M_impl.super__Rb_tree_header)
  {
    p_Var2 = iVar1._M_node + 2;
  }
  return (Type1CharString *)p_Var2;
}

Assistant:

Type1CharString* Type1Input::GetGlyphCharString(const std::string& inCharStringName)
{
	StringToType1CharStringMap::iterator it = mCharStrings.find(inCharStringName);
	if(it == mCharStrings.end())
		return NULL;
	else
		return &(it->second);
}